

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O0

void mbedtls_mpi_core_cond_swap
               (mbedtls_mpi_uint *X,mbedtls_mpi_uint *Y,size_t limbs,mbedtls_ct_condition_t swap)

{
  mbedtls_mpi_uint mVar1;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  mbedtls_mpi_uint tmp;
  size_t i;
  mbedtls_mpi_uint in_stack_ffffffffffffffc8;
  mbedtls_ct_condition_t condition;
  undefined8 local_28;
  
  if (in_RDI != in_RSI) {
    for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
      condition = *(mbedtls_ct_condition_t *)(in_RDI + local_28 * 8);
      mVar1 = mbedtls_ct_mpi_uint_if(condition,in_stack_ffffffffffffffc8,0x86f1db);
      *(mbedtls_mpi_uint *)(in_RDI + local_28 * 8) = mVar1;
      mVar1 = mbedtls_ct_mpi_uint_if(condition,in_stack_ffffffffffffffc8,0x86f209);
      *(mbedtls_mpi_uint *)(in_RSI + local_28 * 8) = mVar1;
    }
  }
  return;
}

Assistant:

void mbedtls_mpi_core_cond_swap(mbedtls_mpi_uint *X,
                                mbedtls_mpi_uint *Y,
                                size_t limbs,
                                mbedtls_ct_condition_t swap)
{
    if (X == Y) {
        return;
    }

    for (size_t i = 0; i < limbs; i++) {
        mbedtls_mpi_uint tmp = X[i];
        X[i] = mbedtls_ct_mpi_uint_if(swap, Y[i], X[i]);
        Y[i] = mbedtls_ct_mpi_uint_if(swap, tmp, Y[i]);
    }
}